

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap.c
# Opt level: O3

void al_set_bitmap_blender(int op,int src,int dest)

{
  ALLEGRO_BITMAP *pAVar1;
  
  al_get_target_bitmap();
  pAVar1 = al_get_target_bitmap();
  pAVar1->use_bitmap_blender = true;
  (pAVar1->blender).blend_op = op;
  (pAVar1->blender).blend_source = src;
  (pAVar1->blender).blend_dest = dest;
  (pAVar1->blender).blend_alpha_op = op;
  (pAVar1->blender).blend_alpha_source = src;
  (pAVar1->blender).blend_alpha_dest = dest;
  return;
}

Assistant:

void al_set_bitmap_blender(int op, int src, int dest)
{
   ALLEGRO_BITMAP *bitmap = al_get_target_bitmap();

   ASSERT(bitmap);

   al_set_separate_bitmap_blender(op, src, dest, op, src, dest);
}